

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_linal_kalman_predict_U_diag(double *x,double *S,double *U,double *q2,size_t n,size_t m)

{
  ulong uVar1;
  size_t sVar2;
  size_t j10;
  size_t k10;
  size_t k;
  size_t k2;
  size_t k1;
  size_t k0;
  size_t j1;
  size_t j;
  size_t i;
  size_t m_local;
  size_t n_local;
  double *q2_local;
  double *U_local;
  double *S_local;
  double *x_local;
  
  fsnav_linal_u_mul(x,U,x,n,1);
  k1 = 0;
  for (j = 0; j < n; j = j + 1) {
    uVar1 = j * ((n * 2 - j) + 1) >> 1;
    sVar2 = (n - j) - 1;
    for (j1 = j; j1 < n; j1 = j1 + 1) {
      S[k1] = U[uVar1] * S[k1];
      k0 = sVar2;
      k2 = uVar1;
      for (k10 = k1 + sVar2; k2 = k2 + 1, k0 != 0 && k10 <= j1 * ((n * 2 - j1) + 1) >> 1;
          k10 = k0 + k10) {
        S[k1] = S[k10] * U[k2] + S[k1];
        k0 = k0 - 1;
      }
      k1 = k1 + 1;
    }
  }
  fsnav_linal_uuT(S,S,n);
  for (j = 0; j < m; j = j + 1) {
    uVar1 = j * ((n * 2 - j) + 1) >> 1;
    S[uVar1] = q2[j] + S[uVar1];
  }
  fsnav_linal_chol(S,S,n);
  return;
}

Assistant:

void fsnav_linal_kalman_predict_U_diag(double* x, double* S, double* U, double* q2, const size_t n, const size_t m)
{
	size_t i, j, j1, k0, k1, k2, k, k10, j10;

	fsnav_linal_u_mul(x, U, x, n, 1);    // x = F*x  	
	for (i = 0, k0 = 0; i < n; i++) {
		k10 = i*(2*n-i+1)/2;            // start from the diagonal in U
		j10 = n-i-1;
		for (j = i; j < n; j++, k0++) {
			k1 = k10;
			S[k0] *= U[k1];             // S = F*S
			k2 = j*(2*n-j+1)/2;         // finish at the diagonal in S
			for (j1 = j10, k1++, k = k0+j1; j1 > 0 && k <= k2; j1--, k1++, k += j1)
				S[k0] += S[k]*U[k1];
		}
	}
	fsnav_linal_uuT(S, S, n);            // P = S*S^T
	for (i = 0; i < m; i++)
		S[i*(2*n-i+1)/2] += q2[i];      // P = P + Q, Q = [diag(q2) 0; 0 0]
	fsnav_linal_chol(S, S, n);           // P = S*S^T
}